

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# win_helper.c
# Opt level: O1

void cpu_set_cwp_sparc64(CPUSPARCState_conflict1 *env,int new_cwp)

{
  uint32_t uVar1;
  ulong uVar2;
  
  uVar1 = env->nwindows;
  if (env->cwp == uVar1 - 1) {
    uVar2 = (ulong)(uVar1 << 4);
    env->regbase[0] = env->regbase[uVar2];
    env->regbase[1] = env->regbase[uVar2 + 1];
    env->regbase[2] = env->regbase[uVar2 + 2];
    env->regbase[3] = env->regbase[uVar2 + 3];
    env->regbase[4] = env->regbase[uVar2 + 4];
    env->regbase[5] = env->regbase[uVar2 + 5];
    env->regbase[6] = env->regbase[uVar2 + 6];
    env->regbase[7] = env->regbase[uVar2 + 7];
  }
  env->cwp = new_cwp;
  if (uVar1 - 1 == new_cwp) {
    uVar2 = (ulong)(uVar1 << 4);
    env->regbase[uVar2] = env->regbase[0];
    env->regbase[uVar2 + 1] = env->regbase[1];
    env->regbase[uVar2 + 2] = env->regbase[2];
    env->regbase[uVar2 + 3] = env->regbase[3];
    env->regbase[uVar2 + 4] = env->regbase[4];
    env->regbase[uVar2 + 5] = env->regbase[5];
    env->regbase[uVar2 + 6] = env->regbase[6];
    env->regbase[uVar2 + 7] = env->regbase[7];
  }
  env->regwptr = env->regbase + (new_cwp << 4);
  return;
}

Assistant:

void cpu_set_cwp(CPUSPARCState *env, int new_cwp)
{
    /* put the modified wrap registers at their proper location */
    if (env->cwp == env->nwindows - 1) {
        memcpy32(env->regbase, env->regbase + env->nwindows * 16);
    }
    env->cwp = new_cwp;

    /* put the wrap registers at their temporary location */
    if (new_cwp == env->nwindows - 1) {
        memcpy32(env->regbase + env->nwindows * 16, env->regbase);
    }
    env->regwptr = env->regbase + (new_cwp * 16);
}